

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int iVar63;
  AABBNodeMB4D *node1;
  ulong uVar64;
  long lVar65;
  long lVar66;
  uint uVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  ulong *puVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  bool bVar90;
  bool bVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar130 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_d50;
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [32];
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined4 uStack_b44;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar82 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar144 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar147 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar151 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar35 = fVar2 * 0.99999964;
  fVar36 = fVar3 * 0.99999964;
  fVar37 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar86 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar89 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar63 = (tray->tnear).field_0.i[k];
  auVar130 = ZEXT1664(CONCAT412(iVar63,CONCAT48(iVar63,CONCAT44(iVar63,iVar63))));
  iVar63 = (tray->tfar).field_0.i[k];
  auVar140 = ZEXT1664(CONCAT412(iVar63,CONCAT48(iVar63,CONCAT44(iVar63,iVar63))));
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  iVar63 = 1 << ((uint)k & 0x1f);
  auVar95._4_4_ = iVar63;
  auVar95._0_4_ = iVar63;
  auVar95._8_4_ = iVar63;
  auVar95._12_4_ = iVar63;
  auVar95._16_4_ = iVar63;
  auVar95._20_4_ = iVar63;
  auVar95._24_4_ = iVar63;
  auVar95._28_4_ = iVar63;
  auVar96 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar95 = vpand_avx2(auVar95,auVar96);
  local_b80 = vpcmpeqd_avx2(auVar95,auVar96);
  bVar91 = true;
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar96._8_4_ = 0xbf800000;
  auVar96._0_8_ = 0xbf800000bf800000;
  auVar96._12_4_ = 0xbf800000;
  auVar96._16_4_ = 0xbf800000;
  auVar96._20_4_ = 0xbf800000;
  auVar96._24_4_ = 0xbf800000;
  auVar96._28_4_ = 0xbf800000;
  _local_b60 = vblendvps_avx(auVar101,auVar96,local_b40);
  do {
    uVar88 = puVar82[-1];
    puVar82 = puVar82 + -1;
    while( true ) {
      auVar141 = auVar144._0_16_;
      auVar93 = auVar130._0_16_;
      auVar113 = auVar147._0_16_;
      auVar119 = auVar151._0_16_;
      auVar137 = auVar140._0_16_;
      if ((uVar88 & 8) != 0) break;
      uVar64 = uVar88 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar92._4_4_ = uVar1;
      auVar92._0_4_ = uVar1;
      auVar92._8_4_ = uVar1;
      auVar92._12_4_ = uVar1;
      auVar107 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar64 + 0x80 + uVar86),auVar92,
                                 *(undefined1 (*) [16])(uVar64 + 0x20 + uVar86));
      auVar107 = vsubps_avx(auVar107,auVar141);
      auVar99._0_4_ = fVar35 * auVar107._0_4_;
      auVar99._4_4_ = fVar35 * auVar107._4_4_;
      auVar99._8_4_ = fVar35 * auVar107._8_4_;
      auVar99._12_4_ = fVar35 * auVar107._12_4_;
      auVar93 = vmaxps_avx(auVar93,auVar99);
      auVar107 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar64 + 0x80 + uVar89),auVar92,
                                 *(undefined1 (*) [16])(uVar64 + 0x20 + uVar89));
      auVar107 = vsubps_avx(auVar107,auVar113);
      auVar106._0_4_ = fVar36 * auVar107._0_4_;
      auVar106._4_4_ = fVar36 * auVar107._4_4_;
      auVar106._8_4_ = fVar36 * auVar107._8_4_;
      auVar106._12_4_ = fVar36 * auVar107._12_4_;
      auVar107 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar64 + 0x80 + uVar69),auVar92,
                                 *(undefined1 (*) [16])(uVar64 + 0x20 + uVar69));
      auVar107 = vsubps_avx(auVar107,auVar119);
      auVar112._0_4_ = fVar37 * auVar107._0_4_;
      auVar112._4_4_ = fVar37 * auVar107._4_4_;
      auVar112._8_4_ = fVar37 * auVar107._8_4_;
      auVar112._12_4_ = fVar37 * auVar107._12_4_;
      auVar107 = vmaxps_avx(auVar106,auVar112);
      auVar93 = vmaxps_avx(auVar93,auVar107);
      auVar107 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar64 + 0x80 + (uVar86 ^ 0x10)),auVar92,
                                 *(undefined1 (*) [16])(uVar64 + 0x20 + (uVar86 ^ 0x10)));
      auVar141 = vsubps_avx(auVar107,auVar141);
      auVar107._0_4_ = fVar2 * auVar141._0_4_;
      auVar107._4_4_ = fVar2 * auVar141._4_4_;
      auVar107._8_4_ = fVar2 * auVar141._8_4_;
      auVar107._12_4_ = fVar2 * auVar141._12_4_;
      auVar141 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar64 + 0x80 + (uVar89 ^ 0x10)),auVar92,
                                 *(undefined1 (*) [16])(uVar64 + 0x20 + (uVar89 ^ 0x10)));
      auVar137 = vminps_avx(auVar137,auVar107);
      auVar141 = vsubps_avx(auVar141,auVar113);
      auVar113._0_4_ = fVar3 * auVar141._0_4_;
      auVar113._4_4_ = fVar3 * auVar141._4_4_;
      auVar113._8_4_ = fVar3 * auVar141._8_4_;
      auVar113._12_4_ = fVar3 * auVar141._12_4_;
      auVar141 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar64 + 0x80 + (uVar69 ^ 0x10)),auVar92,
                                 *(undefined1 (*) [16])(uVar64 + 0x20 + (uVar69 ^ 0x10)));
      auVar141 = vsubps_avx(auVar141,auVar119);
      auVar119._0_4_ = fVar4 * auVar141._0_4_;
      auVar119._4_4_ = fVar4 * auVar141._4_4_;
      auVar119._8_4_ = fVar4 * auVar141._8_4_;
      auVar119._12_4_ = fVar4 * auVar141._12_4_;
      auVar141 = vminps_avx(auVar113,auVar119);
      auVar137 = vminps_avx(auVar137,auVar141);
      if (((uint)uVar88 & 7) == 6) {
        auVar137 = vcmpps_avx(auVar93,auVar137,2);
        auVar93 = vcmpps_avx(*(undefined1 (*) [16])(uVar64 + 0xe0),auVar92,2);
        auVar141 = vcmpps_avx(auVar92,*(undefined1 (*) [16])(uVar64 + 0xf0),1);
        auVar93 = vandps_avx(auVar93,auVar141);
        auVar93 = vandps_avx(auVar93,auVar137);
      }
      else {
        auVar93 = vcmpps_avx(auVar93,auVar137,2);
      }
      auVar93 = vpslld_avx(auVar93,0x1f);
      uVar67 = vmovmskps_avx(auVar93);
      if (uVar67 == 0) goto LAB_005881ef;
      lVar68 = 0;
      for (uVar88 = (ulong)(byte)uVar67; (uVar88 & 1) == 0;
          uVar88 = uVar88 >> 1 | 0x8000000000000000) {
        lVar68 = lVar68 + 1;
      }
      uVar88 = *(ulong *)(uVar64 + lVar68 * 8);
      uVar67 = (uVar67 & 0xff) - 1 & uVar67 & 0xff;
      uVar70 = (ulong)uVar67;
      if (uVar67 != 0) {
        *puVar82 = uVar88;
        lVar68 = 0;
        for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
          lVar68 = lVar68 + 1;
        }
        uVar67 = uVar67 - 1 & uVar67;
        uVar70 = (ulong)uVar67;
        bVar90 = uVar67 == 0;
        while( true ) {
          puVar82 = puVar82 + 1;
          uVar88 = *(ulong *)(uVar64 + lVar68 * 8);
          if (bVar90) break;
          *puVar82 = uVar88;
          lVar68 = 0;
          for (uVar88 = uVar70; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
            lVar68 = lVar68 + 1;
          }
          uVar70 = uVar70 - 1 & uVar70;
          bVar90 = uVar70 == 0;
        }
      }
    }
    uVar64 = (ulong)((uint)uVar88 & 0xf);
    if (uVar64 != 8) {
      uVar88 = uVar88 & 0xfffffffffffffff0;
      lVar68 = 0;
      do {
        lVar65 = lVar68 * 0x60;
        pSVar9 = context->scene;
        pRVar10 = (pSVar9->geometries).items;
        pGVar11 = pRVar10[*(uint *)(uVar88 + 0x40 + lVar65)].ptr;
        fVar5 = (pGVar11->time_range).lower;
        fVar5 = pGVar11->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar5) / ((pGVar11->time_range).upper - fVar5));
        auVar107 = vroundss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),9);
        auVar107 = vminss_avx(auVar107,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
        auVar126 = vmaxss_avx(ZEXT816(0) << 0x20,auVar107);
        iVar63 = (int)auVar126._0_4_;
        lVar79 = (long)iVar63 * 0x38;
        lVar12 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar79);
        uVar78 = (ulong)*(uint *)(uVar88 + 4 + lVar65);
        auVar107 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar88 + lVar65) * 4);
        uVar72 = (ulong)*(uint *)(uVar88 + 0x10 + lVar65);
        auVar92 = *(undefined1 (*) [16])(lVar12 + uVar72 * 4);
        uVar71 = (ulong)*(uint *)(uVar88 + 0x20 + lVar65);
        auVar99 = *(undefined1 (*) [16])(lVar12 + uVar71 * 4);
        uVar73 = (ulong)*(uint *)(uVar88 + 0x30 + lVar65);
        auVar106 = *(undefined1 (*) [16])(lVar12 + uVar73 * 4);
        lVar12 = *(long *)&pRVar10[*(uint *)(uVar88 + 0x44 + lVar65)].ptr[2].numPrimitives;
        lVar13 = *(long *)(lVar12 + lVar79);
        auVar120 = *(undefined1 (*) [16])(lVar13 + uVar78 * 4);
        uVar74 = (ulong)*(uint *)(uVar88 + 0x14 + lVar65);
        auVar108 = *(undefined1 (*) [16])(lVar13 + uVar74 * 4);
        uVar75 = (ulong)*(uint *)(uVar88 + 0x24 + lVar65);
        auVar112 = *(undefined1 (*) [16])(lVar13 + uVar75 * 4);
        uVar76 = (ulong)*(uint *)(uVar88 + 0x34 + lVar65);
        auVar94 = *(undefined1 (*) [16])(lVar13 + uVar76 * 4);
        lVar13 = *(long *)&pRVar10[*(uint *)(uVar88 + 0x48 + lVar65)].ptr[2].numPrimitives;
        lVar14 = *(long *)(lVar13 + lVar79);
        uVar77 = (ulong)*(uint *)(uVar88 + 8 + lVar65);
        auVar114 = *(undefined1 (*) [16])(lVar14 + uVar77 * 4);
        uVar83 = (ulong)*(uint *)(uVar88 + 0x18 + lVar65);
        auVar168 = *(undefined1 (*) [16])(lVar14 + uVar83 * 4);
        uVar84 = (ulong)*(uint *)(uVar88 + 0x28 + lVar65);
        auVar7 = *(undefined1 (*) [16])(lVar14 + uVar84 * 4);
        uVar85 = (ulong)*(uint *)(uVar88 + 0x38 + lVar65);
        auVar8 = *(undefined1 (*) [16])(lVar14 + uVar85 * 4);
        fVar5 = fVar5 - auVar126._0_4_;
        lVar14 = *(long *)&pRVar10[*(uint *)(uVar88 + 0x4c + lVar65)].ptr[2].numPrimitives;
        lVar79 = *(long *)(lVar14 + lVar79);
        uVar70 = (ulong)*(uint *)(uVar88 + 0xc + lVar65);
        auVar126 = *(undefined1 (*) [16])(lVar79 + uVar70 * 4);
        uVar80 = (ulong)*(uint *)(uVar88 + 0x1c + lVar65);
        auVar142 = *(undefined1 (*) [16])(lVar79 + uVar80 * 4);
        auVar145 = vunpcklps_avx(auVar107,auVar114);
        auVar114 = vunpckhps_avx(auVar107,auVar114);
        auVar149 = vunpcklps_avx(auVar120,auVar126);
        auVar120 = vunpckhps_avx(auVar120,auVar126);
        uVar81 = (ulong)*(uint *)(uVar88 + 0x2c + lVar65);
        auVar107 = *(undefined1 (*) [16])(lVar79 + uVar81 * 4);
        auVar126 = vunpcklps_avx(auVar114,auVar120);
        local_b90 = vunpcklps_avx(auVar145,auVar149);
        auVar120 = vunpckhps_avx(auVar145,auVar149);
        auVar145 = vunpcklps_avx(auVar92,auVar168);
        auVar114 = vunpckhps_avx(auVar92,auVar168);
        auVar168 = vunpcklps_avx(auVar108,auVar142);
        auVar108 = vunpckhps_avx(auVar108,auVar142);
        uVar87 = (ulong)*(uint *)(uVar88 + 0x3c + lVar65);
        auVar92 = *(undefined1 (*) [16])(lVar79 + uVar87 * 4);
        auVar114 = vunpcklps_avx(auVar114,auVar108);
        auVar142 = vunpcklps_avx(auVar145,auVar168);
        auVar108 = vunpckhps_avx(auVar145,auVar168);
        auVar168 = vunpcklps_avx(auVar99,auVar7);
        auVar99 = vunpckhps_avx(auVar99,auVar7);
        auVar7 = vunpcklps_avx(auVar112,auVar107);
        auVar112 = vunpckhps_avx(auVar112,auVar107);
        lVar66 = (long)(iVar63 + 1) * 0x38;
        lVar79 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar66);
        auVar107 = *(undefined1 (*) [16])(lVar79 + (ulong)*(uint *)(uVar88 + lVar65) * 4);
        auVar145 = vunpcklps_avx(auVar99,auVar112);
        auVar149 = vunpcklps_avx(auVar168,auVar7);
        local_bc0 = vunpckhps_avx(auVar168,auVar7);
        auVar112 = vunpcklps_avx(auVar106,auVar8);
        auVar99 = vunpckhps_avx(auVar106,auVar8);
        auVar168 = vunpcklps_avx(auVar94,auVar92);
        auVar106 = vunpckhps_avx(auVar94,auVar92);
        lVar13 = *(long *)(lVar13 + lVar66);
        auVar92 = *(undefined1 (*) [16])(lVar13 + uVar77 * 4);
        auVar7 = vunpcklps_avx(auVar99,auVar106);
        local_ba0 = vunpcklps_avx(auVar112,auVar168);
        local_bb0 = vunpckhps_avx(auVar112,auVar168);
        lVar12 = *(long *)(lVar12 + lVar66);
        auVar106 = vunpcklps_avx(auVar107,auVar92);
        auVar99 = vunpckhps_avx(auVar107,auVar92);
        auVar107 = *(undefined1 (*) [16])(lVar12 + uVar78 * 4);
        lVar14 = *(long *)(lVar14 + lVar66);
        auVar92 = *(undefined1 (*) [16])(lVar14 + uVar70 * 4);
        auVar112 = vunpcklps_avx(auVar107,auVar92);
        auVar107 = vunpckhps_avx(auVar107,auVar92);
        auVar168 = vunpcklps_avx(auVar99,auVar107);
        auVar8 = vunpcklps_avx(auVar106,auVar112);
        auVar99 = vunpckhps_avx(auVar106,auVar112);
        auVar107 = *(undefined1 (*) [16])(lVar79 + uVar72 * 4);
        auVar92 = *(undefined1 (*) [16])(lVar13 + uVar83 * 4);
        auVar112 = vunpcklps_avx(auVar107,auVar92);
        auVar106 = vunpckhps_avx(auVar107,auVar92);
        auVar107 = *(undefined1 (*) [16])(lVar12 + uVar74 * 4);
        auVar92 = *(undefined1 (*) [16])(lVar14 + uVar80 * 4);
        auVar94 = vunpcklps_avx(auVar107,auVar92);
        auVar107 = vunpckhps_avx(auVar107,auVar92);
        auVar158 = vunpcklps_avx(auVar106,auVar107);
        auVar41 = vunpcklps_avx(auVar112,auVar94);
        auVar106 = vunpckhps_avx(auVar112,auVar94);
        auVar107 = *(undefined1 (*) [16])(lVar79 + uVar71 * 4);
        auVar92 = *(undefined1 (*) [16])(lVar13 + uVar84 * 4);
        auVar94 = vunpcklps_avx(auVar107,auVar92);
        auVar112 = vunpckhps_avx(auVar107,auVar92);
        auVar107 = *(undefined1 (*) [16])(lVar12 + uVar75 * 4);
        auVar92 = *(undefined1 (*) [16])(lVar14 + uVar81 * 4);
        auVar100 = vunpcklps_avx(auVar107,auVar92);
        auVar107 = vunpckhps_avx(auVar107,auVar92);
        auVar42 = vunpcklps_avx(auVar112,auVar107);
        auVar43 = vunpcklps_avx(auVar94,auVar100);
        auVar112 = vunpckhps_avx(auVar94,auVar100);
        auVar107 = *(undefined1 (*) [16])(lVar79 + uVar73 * 4);
        auVar92 = *(undefined1 (*) [16])(lVar13 + uVar85 * 4);
        auVar100 = vunpcklps_avx(auVar107,auVar92);
        auVar94 = vunpckhps_avx(auVar107,auVar92);
        auVar107 = *(undefined1 (*) [16])(lVar12 + uVar76 * 4);
        auVar92 = *(undefined1 (*) [16])(lVar14 + uVar87 * 4);
        auVar138 = vunpcklps_avx(auVar107,auVar92);
        auVar107 = vunpckhps_avx(auVar107,auVar92);
        auVar92 = vunpcklps_avx(auVar94,auVar107);
        auVar94 = vunpcklps_avx(auVar100,auVar138);
        auVar107 = vunpckhps_avx(auVar100,auVar138);
        fVar40 = 1.0 - fVar5;
        auVar165._4_4_ = fVar40;
        auVar165._0_4_ = fVar40;
        auVar165._8_4_ = fVar40;
        auVar165._12_4_ = fVar40;
        auVar100._0_4_ = fVar5 * auVar8._0_4_;
        auVar100._4_4_ = fVar5 * auVar8._4_4_;
        auVar100._8_4_ = fVar5 * auVar8._8_4_;
        auVar100._12_4_ = fVar5 * auVar8._12_4_;
        auVar8 = vfmadd231ps_fma(auVar100,auVar165,local_b90);
        auVar138._0_4_ = fVar5 * auVar99._0_4_;
        auVar138._4_4_ = fVar5 * auVar99._4_4_;
        auVar138._8_4_ = fVar5 * auVar99._8_4_;
        auVar138._12_4_ = fVar5 * auVar99._12_4_;
        auVar99 = vfmadd231ps_fma(auVar138,auVar165,auVar120);
        auVar120._0_4_ = auVar168._0_4_ * fVar5;
        auVar120._4_4_ = auVar168._4_4_ * fVar5;
        auVar120._8_4_ = auVar168._8_4_ * fVar5;
        auVar120._12_4_ = auVar168._12_4_ * fVar5;
        auVar120 = vfmadd231ps_fma(auVar120,auVar165,auVar126);
        auVar168._0_4_ = fVar5 * auVar41._0_4_;
        auVar168._4_4_ = fVar5 * auVar41._4_4_;
        auVar168._8_4_ = fVar5 * auVar41._8_4_;
        auVar168._12_4_ = fVar5 * auVar41._12_4_;
        auVar168 = vfmadd231ps_fma(auVar168,auVar165,auVar142);
        auVar126._0_4_ = fVar5 * auVar106._0_4_;
        auVar126._4_4_ = fVar5 * auVar106._4_4_;
        auVar126._8_4_ = fVar5 * auVar106._8_4_;
        auVar126._12_4_ = fVar5 * auVar106._12_4_;
        auVar106 = vfmadd231ps_fma(auVar126,auVar165,auVar108);
        auVar108._0_4_ = auVar158._0_4_ * fVar5;
        auVar108._4_4_ = auVar158._4_4_ * fVar5;
        auVar108._8_4_ = auVar158._8_4_ * fVar5;
        auVar108._12_4_ = auVar158._12_4_ * fVar5;
        auVar108 = vfmadd231ps_fma(auVar108,auVar165,auVar114);
        auVar114._0_4_ = fVar5 * auVar43._0_4_;
        auVar114._4_4_ = fVar5 * auVar43._4_4_;
        auVar114._8_4_ = fVar5 * auVar43._8_4_;
        auVar114._12_4_ = fVar5 * auVar43._12_4_;
        auVar114 = vfmadd231ps_fma(auVar114,auVar165,auVar149);
        auVar149._0_4_ = auVar112._0_4_ * fVar5;
        auVar149._4_4_ = auVar112._4_4_ * fVar5;
        auVar149._8_4_ = auVar112._8_4_ * fVar5;
        auVar149._12_4_ = auVar112._12_4_ * fVar5;
        auVar112 = vfmadd231ps_fma(auVar149,auVar165,local_bc0);
        auVar158._0_4_ = auVar42._0_4_ * fVar5;
        auVar158._4_4_ = auVar42._4_4_ * fVar5;
        auVar158._8_4_ = auVar42._8_4_ * fVar5;
        auVar158._12_4_ = auVar42._12_4_ * fVar5;
        auVar126 = vfmadd231ps_fma(auVar158,auVar165,auVar145);
        auVar142._0_4_ = fVar5 * auVar94._0_4_;
        auVar142._4_4_ = fVar5 * auVar94._4_4_;
        auVar142._8_4_ = fVar5 * auVar94._8_4_;
        auVar142._12_4_ = fVar5 * auVar94._12_4_;
        auVar145._0_4_ = auVar107._0_4_ * fVar5;
        auVar145._4_4_ = auVar107._4_4_ * fVar5;
        auVar145._8_4_ = auVar107._8_4_ * fVar5;
        auVar145._12_4_ = auVar107._12_4_ * fVar5;
        lVar12 = uVar88 + 0x40 + lVar65;
        local_b00 = *(undefined8 *)(lVar12 + 0x10);
        uStack_af8 = *(undefined8 *)(lVar12 + 0x18);
        auVar94._0_4_ = auVar92._0_4_ * fVar5;
        auVar94._4_4_ = auVar92._4_4_ * fVar5;
        auVar94._8_4_ = auVar92._8_4_ * fVar5;
        auVar94._12_4_ = auVar92._12_4_ * fVar5;
        uStack_af0 = local_b00;
        uStack_ae8 = uStack_af8;
        lVar65 = uVar88 + 0x50 + lVar65;
        local_b20 = *(undefined8 *)(lVar65 + 0x10);
        uStack_b18 = *(undefined8 *)(lVar65 + 0x18);
        auVar107 = vfmadd231ps_fma(auVar142,auVar165,local_ba0);
        auVar92 = vfmadd231ps_fma(auVar145,auVar165,local_bb0);
        auVar94 = vfmadd231ps_fma(auVar94,auVar165,auVar7);
        uStack_b10 = local_b20;
        uStack_b08 = uStack_b18;
        auVar102._16_16_ = auVar114;
        auVar102._0_16_ = auVar8;
        auVar115._16_16_ = auVar112;
        auVar115._0_16_ = auVar99;
        auVar121._16_16_ = auVar126;
        auVar121._0_16_ = auVar120;
        auVar139._16_16_ = auVar168;
        auVar139._0_16_ = auVar168;
        auVar127._16_16_ = auVar106;
        auVar127._0_16_ = auVar106;
        auVar109._16_16_ = auVar108;
        auVar109._0_16_ = auVar108;
        auVar169._16_16_ = auVar107;
        auVar169._0_16_ = auVar107;
        auVar166._16_16_ = auVar92;
        auVar166._0_16_ = auVar92;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar159._4_4_ = uVar1;
        auVar159._0_4_ = uVar1;
        auVar159._8_4_ = uVar1;
        auVar159._12_4_ = uVar1;
        auVar159._16_4_ = uVar1;
        auVar159._20_4_ = uVar1;
        auVar159._24_4_ = uVar1;
        auVar159._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar162._4_4_ = uVar1;
        auVar162._0_4_ = uVar1;
        auVar162._8_4_ = uVar1;
        auVar162._12_4_ = uVar1;
        auVar162._16_4_ = uVar1;
        auVar162._20_4_ = uVar1;
        auVar162._24_4_ = uVar1;
        auVar162._28_4_ = uVar1;
        auVar97._16_16_ = auVar94;
        auVar97._0_16_ = auVar94;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar164._4_4_ = uVar1;
        auVar164._0_4_ = uVar1;
        auVar164._8_4_ = uVar1;
        auVar164._12_4_ = uVar1;
        auVar164._16_4_ = uVar1;
        auVar164._20_4_ = uVar1;
        auVar164._24_4_ = uVar1;
        auVar164._28_4_ = uVar1;
        auVar102 = vsubps_avx(auVar102,auVar159);
        auVar115 = vsubps_avx(auVar115,auVar162);
        local_c00 = vsubps_avx(auVar121,auVar164);
        auVar95 = vsubps_avx(auVar139,auVar159);
        auVar96 = vsubps_avx(auVar127,auVar162);
        auVar101 = vsubps_avx(auVar109,auVar164);
        auVar109 = vsubps_avx(auVar169,auVar159);
        auVar121 = vsubps_avx(auVar166,auVar162);
        auVar38 = vsubps_avx(auVar97,auVar164);
        local_c20 = vsubps_avx(auVar109,auVar102);
        local_c60 = vsubps_avx(auVar121,auVar115);
        local_c40 = vsubps_avx(auVar38,local_c00);
        auVar98._0_4_ = auVar102._0_4_ + auVar109._0_4_;
        auVar98._4_4_ = auVar102._4_4_ + auVar109._4_4_;
        auVar98._8_4_ = auVar102._8_4_ + auVar109._8_4_;
        auVar98._12_4_ = auVar102._12_4_ + auVar109._12_4_;
        auVar98._16_4_ = auVar102._16_4_ + auVar109._16_4_;
        auVar98._20_4_ = auVar102._20_4_ + auVar109._20_4_;
        auVar98._24_4_ = auVar102._24_4_ + auVar109._24_4_;
        auVar98._28_4_ = auVar102._28_4_ + auVar109._28_4_;
        auVar110._0_4_ = auVar121._0_4_ + auVar115._0_4_;
        auVar110._4_4_ = auVar121._4_4_ + auVar115._4_4_;
        auVar110._8_4_ = auVar121._8_4_ + auVar115._8_4_;
        auVar110._12_4_ = auVar121._12_4_ + auVar115._12_4_;
        auVar110._16_4_ = auVar121._16_4_ + auVar115._16_4_;
        auVar110._20_4_ = auVar121._20_4_ + auVar115._20_4_;
        auVar110._24_4_ = auVar121._24_4_ + auVar115._24_4_;
        fVar125 = auVar115._28_4_;
        auVar110._28_4_ = auVar121._28_4_ + fVar125;
        fVar5 = local_c00._0_4_;
        auVar122._0_4_ = auVar38._0_4_ + fVar5;
        fVar40 = local_c00._4_4_;
        auVar122._4_4_ = auVar38._4_4_ + fVar40;
        fVar16 = local_c00._8_4_;
        auVar122._8_4_ = auVar38._8_4_ + fVar16;
        fVar17 = local_c00._12_4_;
        auVar122._12_4_ = auVar38._12_4_ + fVar17;
        fVar18 = local_c00._16_4_;
        auVar122._16_4_ = auVar38._16_4_ + fVar18;
        fVar19 = local_c00._20_4_;
        auVar122._20_4_ = auVar38._20_4_ + fVar19;
        fVar20 = local_c00._24_4_;
        fVar148 = auVar38._28_4_;
        auVar122._24_4_ = auVar38._24_4_ + fVar20;
        auVar122._28_4_ = fVar148 + local_c00._28_4_;
        auVar39._4_4_ = local_c40._4_4_ * auVar110._4_4_;
        auVar39._0_4_ = local_c40._0_4_ * auVar110._0_4_;
        auVar39._8_4_ = local_c40._8_4_ * auVar110._8_4_;
        auVar39._12_4_ = local_c40._12_4_ * auVar110._12_4_;
        auVar39._16_4_ = local_c40._16_4_ * auVar110._16_4_;
        auVar39._20_4_ = local_c40._20_4_ * auVar110._20_4_;
        auVar39._24_4_ = local_c40._24_4_ * auVar110._24_4_;
        auVar39._28_4_ = uVar1;
        auVar92 = vfmsub231ps_fma(auVar39,local_c60,auVar122);
        auVar44._4_4_ = local_c20._4_4_ * auVar122._4_4_;
        auVar44._0_4_ = local_c20._0_4_ * auVar122._0_4_;
        auVar44._8_4_ = local_c20._8_4_ * auVar122._8_4_;
        auVar44._12_4_ = local_c20._12_4_ * auVar122._12_4_;
        auVar44._16_4_ = local_c20._16_4_ * auVar122._16_4_;
        auVar44._20_4_ = local_c20._20_4_ * auVar122._20_4_;
        auVar44._24_4_ = local_c20._24_4_ * auVar122._24_4_;
        auVar44._28_4_ = auVar122._28_4_;
        auVar107 = vfmsub231ps_fma(auVar44,local_c40,auVar98);
        auVar45._4_4_ = local_c60._4_4_ * auVar98._4_4_;
        auVar45._0_4_ = local_c60._0_4_ * auVar98._0_4_;
        auVar45._8_4_ = local_c60._8_4_ * auVar98._8_4_;
        auVar45._12_4_ = local_c60._12_4_ * auVar98._12_4_;
        auVar45._16_4_ = local_c60._16_4_ * auVar98._16_4_;
        auVar45._20_4_ = local_c60._20_4_ * auVar98._20_4_;
        auVar45._24_4_ = local_c60._24_4_ * auVar98._24_4_;
        auVar45._28_4_ = auVar98._28_4_;
        auVar99 = vfmsub231ps_fma(auVar45,local_c20,auVar110);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar163._4_4_ = uVar1;
        auVar163._0_4_ = uVar1;
        auVar163._8_4_ = uVar1;
        auVar163._12_4_ = uVar1;
        auVar163._16_4_ = uVar1;
        auVar163._20_4_ = uVar1;
        auVar163._24_4_ = uVar1;
        auVar163._28_4_ = uVar1;
        fStack_c70 = *(float *)(ray + k * 4 + 0xc0);
        auVar46._4_4_ = fStack_c70 * auVar99._4_4_;
        auVar46._0_4_ = fStack_c70 * auVar99._0_4_;
        auVar46._8_4_ = fStack_c70 * auVar99._8_4_;
        auVar46._12_4_ = fStack_c70 * auVar99._12_4_;
        auVar46._16_4_ = fStack_c70 * 0.0;
        auVar46._20_4_ = fStack_c70 * 0.0;
        auVar46._24_4_ = fStack_c70 * 0.0;
        auVar46._28_4_ = auVar110._28_4_;
        auVar107 = vfmadd231ps_fma(auVar46,auVar163,ZEXT1632(auVar107));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar167._4_4_ = uVar1;
        auVar167._0_4_ = uVar1;
        auVar167._8_4_ = uVar1;
        auVar167._12_4_ = uVar1;
        auVar167._16_4_ = uVar1;
        auVar167._20_4_ = uVar1;
        auVar167._24_4_ = uVar1;
        auVar167._28_4_ = uVar1;
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar167,ZEXT1632(auVar92));
        local_ca0 = vsubps_avx(auVar115,auVar96);
        local_ce0 = vsubps_avx(local_c00,auVar101);
        auVar128._0_4_ = auVar96._0_4_ + auVar115._0_4_;
        auVar128._4_4_ = auVar96._4_4_ + auVar115._4_4_;
        auVar128._8_4_ = auVar96._8_4_ + auVar115._8_4_;
        auVar128._12_4_ = auVar96._12_4_ + auVar115._12_4_;
        auVar128._16_4_ = auVar96._16_4_ + auVar115._16_4_;
        auVar128._20_4_ = auVar96._20_4_ + auVar115._20_4_;
        auVar128._24_4_ = auVar96._24_4_ + auVar115._24_4_;
        auVar128._28_4_ = auVar96._28_4_ + fVar125;
        auVar123._0_4_ = fVar5 + auVar101._0_4_;
        auVar123._4_4_ = fVar40 + auVar101._4_4_;
        auVar123._8_4_ = fVar16 + auVar101._8_4_;
        auVar123._12_4_ = fVar17 + auVar101._12_4_;
        auVar123._16_4_ = fVar18 + auVar101._16_4_;
        auVar123._20_4_ = fVar19 + auVar101._20_4_;
        auVar123._24_4_ = fVar20 + auVar101._24_4_;
        auVar123._28_4_ = local_c00._28_4_ + auVar101._28_4_;
        fVar131 = local_ce0._0_4_;
        fVar133 = local_ce0._4_4_;
        auVar47._4_4_ = auVar128._4_4_ * fVar133;
        auVar47._0_4_ = auVar128._0_4_ * fVar131;
        fVar136 = local_ce0._8_4_;
        auVar47._8_4_ = auVar128._8_4_ * fVar136;
        fVar23 = local_ce0._12_4_;
        auVar47._12_4_ = auVar128._12_4_ * fVar23;
        fVar26 = local_ce0._16_4_;
        auVar47._16_4_ = auVar128._16_4_ * fVar26;
        fVar29 = local_ce0._20_4_;
        auVar47._20_4_ = auVar128._20_4_ * fVar29;
        fVar32 = local_ce0._24_4_;
        auVar47._24_4_ = auVar128._24_4_ * fVar32;
        auVar47._28_4_ = fVar125;
        auVar99 = vfmsub231ps_fma(auVar47,local_ca0,auVar123);
        local_cc0 = vsubps_avx(auVar102,auVar95);
        fVar125 = local_cc0._0_4_;
        fVar134 = local_cc0._4_4_;
        auVar48._4_4_ = auVar123._4_4_ * fVar134;
        auVar48._0_4_ = auVar123._0_4_ * fVar125;
        fVar21 = local_cc0._8_4_;
        auVar48._8_4_ = auVar123._8_4_ * fVar21;
        fVar24 = local_cc0._12_4_;
        auVar48._12_4_ = auVar123._12_4_ * fVar24;
        fVar27 = local_cc0._16_4_;
        auVar48._16_4_ = auVar123._16_4_ * fVar27;
        fVar30 = local_cc0._20_4_;
        auVar48._20_4_ = auVar123._20_4_ * fVar30;
        fVar33 = local_cc0._24_4_;
        auVar48._24_4_ = auVar123._24_4_ * fVar33;
        auVar48._28_4_ = auVar123._28_4_;
        auVar150._0_4_ = auVar102._0_4_ + auVar95._0_4_;
        auVar150._4_4_ = auVar102._4_4_ + auVar95._4_4_;
        auVar150._8_4_ = auVar102._8_4_ + auVar95._8_4_;
        auVar150._12_4_ = auVar102._12_4_ + auVar95._12_4_;
        auVar150._16_4_ = auVar102._16_4_ + auVar95._16_4_;
        auVar150._20_4_ = auVar102._20_4_ + auVar95._20_4_;
        auVar150._24_4_ = auVar102._24_4_ + auVar95._24_4_;
        auVar150._28_4_ = auVar102._28_4_ + auVar95._28_4_;
        auVar92 = vfmsub231ps_fma(auVar48,local_ce0,auVar150);
        fVar132 = local_ca0._0_4_;
        fVar135 = local_ca0._4_4_;
        auVar49._4_4_ = auVar150._4_4_ * fVar135;
        auVar49._0_4_ = auVar150._0_4_ * fVar132;
        fVar22 = local_ca0._8_4_;
        auVar49._8_4_ = auVar150._8_4_ * fVar22;
        fVar25 = local_ca0._12_4_;
        auVar49._12_4_ = auVar150._12_4_ * fVar25;
        fVar28 = local_ca0._16_4_;
        auVar49._16_4_ = auVar150._16_4_ * fVar28;
        fVar31 = local_ca0._20_4_;
        auVar49._20_4_ = auVar150._20_4_ * fVar31;
        fVar34 = local_ca0._24_4_;
        auVar49._24_4_ = auVar150._24_4_ * fVar34;
        auVar49._28_4_ = auVar150._28_4_;
        auVar106 = vfmsub231ps_fma(auVar49,local_cc0,auVar128);
        auVar50._4_4_ = auVar106._4_4_ * fStack_c70;
        auVar50._0_4_ = auVar106._0_4_ * fStack_c70;
        auVar50._8_4_ = auVar106._8_4_ * fStack_c70;
        auVar50._12_4_ = auVar106._12_4_ * fStack_c70;
        auVar50._16_4_ = fStack_c70 * 0.0;
        auVar50._20_4_ = fStack_c70 * 0.0;
        auVar50._24_4_ = fStack_c70 * 0.0;
        auVar50._28_4_ = local_ce0._28_4_;
        auVar92 = vfmadd231ps_fma(auVar50,auVar163,ZEXT1632(auVar92));
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar167,ZEXT1632(auVar99));
        auVar39 = vsubps_avx(auVar95,auVar109);
        auVar116._0_4_ = auVar95._0_4_ + auVar109._0_4_;
        auVar116._4_4_ = auVar95._4_4_ + auVar109._4_4_;
        auVar116._8_4_ = auVar95._8_4_ + auVar109._8_4_;
        auVar116._12_4_ = auVar95._12_4_ + auVar109._12_4_;
        auVar116._16_4_ = auVar95._16_4_ + auVar109._16_4_;
        auVar116._20_4_ = auVar95._20_4_ + auVar109._20_4_;
        auVar116._24_4_ = auVar95._24_4_ + auVar109._24_4_;
        auVar116._28_4_ = auVar95._28_4_ + auVar109._28_4_;
        auVar109 = vsubps_avx(auVar96,auVar121);
        auVar129._0_4_ = auVar96._0_4_ + auVar121._0_4_;
        auVar129._4_4_ = auVar96._4_4_ + auVar121._4_4_;
        auVar129._8_4_ = auVar96._8_4_ + auVar121._8_4_;
        auVar129._12_4_ = auVar96._12_4_ + auVar121._12_4_;
        auVar129._16_4_ = auVar96._16_4_ + auVar121._16_4_;
        auVar129._20_4_ = auVar96._20_4_ + auVar121._20_4_;
        auVar129._24_4_ = auVar96._24_4_ + auVar121._24_4_;
        auVar129._28_4_ = auVar96._28_4_ + auVar121._28_4_;
        auVar121 = vsubps_avx(auVar101,auVar38);
        auVar103._0_4_ = auVar101._0_4_ + auVar38._0_4_;
        auVar103._4_4_ = auVar101._4_4_ + auVar38._4_4_;
        auVar103._8_4_ = auVar101._8_4_ + auVar38._8_4_;
        auVar103._12_4_ = auVar101._12_4_ + auVar38._12_4_;
        auVar103._16_4_ = auVar101._16_4_ + auVar38._16_4_;
        auVar103._20_4_ = auVar101._20_4_ + auVar38._20_4_;
        auVar103._24_4_ = auVar101._24_4_ + auVar38._24_4_;
        auVar103._28_4_ = auVar101._28_4_ + fVar148;
        auVar38._4_4_ = auVar121._4_4_ * auVar129._4_4_;
        auVar38._0_4_ = auVar121._0_4_ * auVar129._0_4_;
        auVar38._8_4_ = auVar121._8_4_ * auVar129._8_4_;
        auVar38._12_4_ = auVar121._12_4_ * auVar129._12_4_;
        auVar38._16_4_ = auVar121._16_4_ * auVar129._16_4_;
        auVar38._20_4_ = auVar121._20_4_ * auVar129._20_4_;
        auVar38._24_4_ = auVar121._24_4_ * auVar129._24_4_;
        auVar38._28_4_ = fVar148;
        auVar106 = vfmsub231ps_fma(auVar38,auVar109,auVar103);
        auVar51._4_4_ = auVar103._4_4_ * auVar39._4_4_;
        auVar51._0_4_ = auVar103._0_4_ * auVar39._0_4_;
        auVar51._8_4_ = auVar103._8_4_ * auVar39._8_4_;
        auVar51._12_4_ = auVar103._12_4_ * auVar39._12_4_;
        auVar51._16_4_ = auVar103._16_4_ * auVar39._16_4_;
        auVar51._20_4_ = auVar103._20_4_ * auVar39._20_4_;
        auVar51._24_4_ = auVar103._24_4_ * auVar39._24_4_;
        auVar51._28_4_ = auVar103._28_4_;
        auVar99 = vfmsub231ps_fma(auVar51,auVar121,auVar116);
        auVar52._4_4_ = auVar109._4_4_ * auVar116._4_4_;
        auVar52._0_4_ = auVar109._0_4_ * auVar116._0_4_;
        auVar52._8_4_ = auVar109._8_4_ * auVar116._8_4_;
        auVar52._12_4_ = auVar109._12_4_ * auVar116._12_4_;
        auVar52._16_4_ = auVar109._16_4_ * auVar116._16_4_;
        auVar52._20_4_ = auVar109._20_4_ * auVar116._20_4_;
        auVar52._24_4_ = auVar109._24_4_ * auVar116._24_4_;
        auVar52._28_4_ = auVar116._28_4_;
        auVar120 = vfmsub231ps_fma(auVar52,auVar39,auVar129);
        fStack_c7c = fStack_c70;
        local_c80 = fStack_c70;
        fStack_c78 = fStack_c70;
        fStack_c74 = fStack_c70;
        auVar117._0_4_ = fStack_c70 * auVar120._0_4_;
        auVar117._4_4_ = fStack_c70 * auVar120._4_4_;
        auVar117._8_4_ = fStack_c70 * auVar120._8_4_;
        auVar117._12_4_ = fStack_c70 * auVar120._12_4_;
        auVar117._16_4_ = fStack_c70 * 0.0;
        auVar117._20_4_ = fStack_c70 * 0.0;
        auVar117._24_4_ = fStack_c70 * 0.0;
        auVar117._28_4_ = 0;
        auVar99 = vfmadd231ps_fma(auVar117,auVar163,ZEXT1632(auVar99));
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar167,ZEXT1632(auVar106));
        local_ae0 = auVar107._0_4_;
        fStack_adc = auVar107._4_4_;
        fStack_ad8 = auVar107._8_4_;
        fStack_ad4 = auVar107._12_4_;
        local_aa0 = ZEXT1632(CONCAT412(auVar99._12_4_ + fStack_ad4 + auVar92._12_4_,
                                       CONCAT48(auVar99._8_4_ + fStack_ad8 + auVar92._8_4_,
                                                CONCAT44(auVar99._4_4_ + fStack_adc + auVar92._4_4_,
                                                         auVar99._0_4_ + local_ae0 + auVar92._0_4_))
                                      ));
        auVar104._8_4_ = 0x7fffffff;
        auVar104._0_8_ = 0x7fffffff7fffffff;
        auVar104._12_4_ = 0x7fffffff;
        auVar104._16_4_ = 0x7fffffff;
        auVar104._20_4_ = 0x7fffffff;
        auVar104._24_4_ = 0x7fffffff;
        auVar104._28_4_ = 0x7fffffff;
        local_d00 = ZEXT1632(auVar107);
        auVar95 = vminps_avx(local_d00,ZEXT1632(auVar92));
        auVar95 = vminps_avx(auVar95,ZEXT1632(auVar99));
        local_d20 = vandps_avx(local_aa0,auVar104);
        fVar148 = local_d20._0_4_ * 1.1920929e-07;
        fVar152 = local_d20._4_4_ * 1.1920929e-07;
        auVar53._4_4_ = fVar152;
        auVar53._0_4_ = fVar148;
        fVar153 = local_d20._8_4_ * 1.1920929e-07;
        auVar53._8_4_ = fVar153;
        fVar154 = local_d20._12_4_ * 1.1920929e-07;
        auVar53._12_4_ = fVar154;
        fVar155 = local_d20._16_4_ * 1.1920929e-07;
        auVar53._16_4_ = fVar155;
        fVar156 = local_d20._20_4_ * 1.1920929e-07;
        auVar53._20_4_ = fVar156;
        fVar157 = local_d20._24_4_ * 1.1920929e-07;
        auVar53._24_4_ = fVar157;
        auVar53._28_4_ = 0x34000000;
        auVar143._0_8_ = CONCAT44(fVar152,fVar148) ^ 0x8000000080000000;
        auVar143._8_4_ = -fVar153;
        auVar143._12_4_ = -fVar154;
        auVar143._16_4_ = -fVar155;
        auVar143._20_4_ = -fVar156;
        auVar143._24_4_ = -fVar157;
        auVar143._28_4_ = 0xb4000000;
        auVar95 = vcmpps_avx(auVar95,auVar143,5);
        auVar101 = vmaxps_avx(local_d00,ZEXT1632(auVar92));
        auVar96 = vmaxps_avx(auVar101,ZEXT1632(auVar99));
        auVar96 = vcmpps_avx(auVar96,auVar53,2);
        auVar96 = vorps_avx(auVar95,auVar96);
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar96 >> 0x7f,0) != '\0') ||
              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0xbf,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar96[0x1f] < '\0') {
          auVar54._4_4_ = fVar135 * local_c40._4_4_;
          auVar54._0_4_ = fVar132 * local_c40._0_4_;
          auVar54._8_4_ = fVar22 * local_c40._8_4_;
          auVar54._12_4_ = fVar25 * local_c40._12_4_;
          auVar54._16_4_ = fVar28 * local_c40._16_4_;
          auVar54._20_4_ = fVar31 * local_c40._20_4_;
          auVar54._24_4_ = fVar34 * local_c40._24_4_;
          auVar54._28_4_ = auVar95._28_4_;
          auVar55._4_4_ = fVar134 * local_c60._4_4_;
          auVar55._0_4_ = fVar125 * local_c60._0_4_;
          auVar55._8_4_ = fVar21 * local_c60._8_4_;
          auVar55._12_4_ = fVar24 * local_c60._12_4_;
          auVar55._16_4_ = fVar27 * local_c60._16_4_;
          auVar55._20_4_ = fVar30 * local_c60._20_4_;
          auVar55._24_4_ = fVar33 * local_c60._24_4_;
          auVar55._28_4_ = 0x34000000;
          auVar107 = vfmsub213ps_fma(local_c60,local_ce0,auVar54);
          auVar56._4_4_ = auVar109._4_4_ * fVar133;
          auVar56._0_4_ = auVar109._0_4_ * fVar131;
          auVar56._8_4_ = auVar109._8_4_ * fVar136;
          auVar56._12_4_ = auVar109._12_4_ * fVar23;
          auVar56._16_4_ = auVar109._16_4_ * fVar26;
          auVar56._20_4_ = auVar109._20_4_ * fVar29;
          auVar56._24_4_ = auVar109._24_4_ * fVar32;
          auVar56._28_4_ = auVar101._28_4_;
          auVar57._4_4_ = fVar134 * auVar121._4_4_;
          auVar57._0_4_ = fVar125 * auVar121._0_4_;
          auVar57._8_4_ = fVar21 * auVar121._8_4_;
          auVar57._12_4_ = fVar24 * auVar121._12_4_;
          auVar57._16_4_ = fVar27 * auVar121._16_4_;
          auVar57._20_4_ = fVar30 * auVar121._20_4_;
          auVar57._24_4_ = fVar33 * auVar121._24_4_;
          auVar57._28_4_ = local_d20._28_4_;
          auVar99 = vfmsub213ps_fma(auVar121,local_ca0,auVar56);
          auVar95 = vandps_avx(auVar54,auVar104);
          auVar101 = vandps_avx(auVar56,auVar104);
          auVar95 = vcmpps_avx(auVar95,auVar101,1);
          local_a80 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar107),auVar95);
          auVar58._4_4_ = fVar135 * auVar39._4_4_;
          auVar58._0_4_ = fVar132 * auVar39._0_4_;
          auVar58._8_4_ = fVar22 * auVar39._8_4_;
          auVar58._12_4_ = fVar25 * auVar39._12_4_;
          auVar58._16_4_ = fVar28 * auVar39._16_4_;
          auVar58._20_4_ = fVar31 * auVar39._20_4_;
          auVar58._24_4_ = fVar34 * auVar39._24_4_;
          auVar58._28_4_ = auVar95._28_4_;
          auVar107 = vfmsub213ps_fma(auVar39,local_ce0,auVar57);
          auVar59._4_4_ = local_c20._4_4_ * fVar133;
          auVar59._0_4_ = local_c20._0_4_ * fVar131;
          auVar59._8_4_ = local_c20._8_4_ * fVar136;
          auVar59._12_4_ = local_c20._12_4_ * fVar23;
          auVar59._16_4_ = local_c20._16_4_ * fVar26;
          auVar59._20_4_ = local_c20._20_4_ * fVar29;
          auVar59._24_4_ = local_c20._24_4_ * fVar32;
          auVar59._28_4_ = auVar101._28_4_;
          auVar99 = vfmsub213ps_fma(local_c40,local_cc0,auVar59);
          auVar95 = vandps_avx(auVar59,auVar104);
          auVar101 = vandps_avx(auVar57,auVar104);
          auVar95 = vcmpps_avx(auVar95,auVar101,1);
          local_a60 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar99),auVar95);
          auVar107 = vfmsub213ps_fma(local_c20,local_ca0,auVar55);
          auVar99 = vfmsub213ps_fma(auVar109,local_cc0,auVar58);
          auVar95 = vandps_avx(auVar55,auVar104);
          auVar101 = vandps_avx(auVar58,auVar104);
          auVar95 = vcmpps_avx(auVar95,auVar101,1);
          local_a40 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar107),auVar95);
          auVar107 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
          fVar125 = local_a40._0_4_;
          auVar105._0_4_ = fVar125 * fStack_c70;
          fVar131 = local_a40._4_4_;
          auVar105._4_4_ = fVar131 * fStack_c70;
          fVar132 = local_a40._8_4_;
          auVar105._8_4_ = fVar132 * fStack_c70;
          fVar133 = local_a40._12_4_;
          auVar105._12_4_ = fVar133 * fStack_c70;
          fVar134 = local_a40._16_4_;
          auVar105._16_4_ = fVar134 * fStack_c70;
          fVar135 = local_a40._20_4_;
          auVar105._20_4_ = fVar135 * fStack_c70;
          fVar136 = local_a40._24_4_;
          auVar105._24_4_ = fVar136 * fStack_c70;
          auVar105._28_4_ = 0;
          auVar99 = vfmadd213ps_fma(auVar163,local_a60,auVar105);
          auVar99 = vfmadd213ps_fma(auVar167,local_a80,ZEXT1632(auVar99));
          auVar101 = ZEXT1632(CONCAT412(auVar99._12_4_ + auVar99._12_4_,
                                        CONCAT48(auVar99._8_4_ + auVar99._8_4_,
                                                 CONCAT44(auVar99._4_4_ + auVar99._4_4_,
                                                          auVar99._0_4_ + auVar99._0_4_))));
          auVar60._4_4_ = fVar131 * fVar40;
          auVar60._0_4_ = fVar125 * fVar5;
          auVar60._8_4_ = fVar132 * fVar16;
          auVar60._12_4_ = fVar133 * fVar17;
          auVar60._16_4_ = fVar134 * fVar18;
          auVar60._20_4_ = fVar135 * fVar19;
          auVar60._24_4_ = fVar136 * fVar20;
          auVar60._28_4_ = auVar96._28_4_;
          auVar99 = vfmadd213ps_fma(auVar115,local_a60,auVar60);
          auVar106 = vfmadd213ps_fma(auVar102,local_a80,ZEXT1632(auVar99));
          auVar95 = vrcpps_avx(auVar101);
          auVar160._8_4_ = 0x3f800000;
          auVar160._0_8_ = 0x3f8000003f800000;
          auVar160._12_4_ = 0x3f800000;
          auVar160._16_4_ = 0x3f800000;
          auVar160._20_4_ = 0x3f800000;
          auVar160._24_4_ = 0x3f800000;
          auVar160._28_4_ = 0x3f800000;
          auVar99 = vfnmadd213ps_fma(auVar95,auVar101,auVar160);
          auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar95,auVar95);
          local_9c0 = ZEXT1632(CONCAT412(auVar99._12_4_ * (auVar106._12_4_ + auVar106._12_4_),
                                         CONCAT48(auVar99._8_4_ * (auVar106._8_4_ + auVar106._8_4_),
                                                  CONCAT44(auVar99._4_4_ *
                                                           (auVar106._4_4_ + auVar106._4_4_),
                                                           auVar99._0_4_ *
                                                           (auVar106._0_4_ + auVar106._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar146._4_4_ = uVar1;
          auVar146._0_4_ = uVar1;
          auVar146._8_4_ = uVar1;
          auVar146._12_4_ = uVar1;
          auVar146._16_4_ = uVar1;
          auVar146._20_4_ = uVar1;
          auVar146._24_4_ = uVar1;
          auVar146._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar161._4_4_ = uVar1;
          auVar161._0_4_ = uVar1;
          auVar161._8_4_ = uVar1;
          auVar161._12_4_ = uVar1;
          auVar161._16_4_ = uVar1;
          auVar161._20_4_ = uVar1;
          auVar161._24_4_ = uVar1;
          auVar161._28_4_ = uVar1;
          auVar95 = vcmpps_avx(auVar146,local_9c0,2);
          auVar96 = vcmpps_avx(local_9c0,auVar161,2);
          auVar95 = vandps_avx(auVar95,auVar96);
          auVar99 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
          auVar107 = vpand_avx(auVar99,auVar107);
          auVar95 = vpmovsxwd_avx2(auVar107);
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            auVar95 = vcmpps_avx(auVar101,_DAT_01faff00,4);
            auVar99 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
            auVar107 = vpand_avx(auVar107,auVar99);
            local_a20 = vpmovsxwd_avx2(auVar107);
            if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_a20 >> 0x7f,0) != '\0') ||
                  (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_a20 >> 0xbf,0) != '\0') ||
                (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_a20[0x1f] < '\0') {
              uStack_ad0 = 0;
              uStack_acc = 0;
              uStack_ac8 = 0;
              uStack_ac4 = 0;
              local_ac0 = ZEXT1632(auVar92);
              local_940 = local_b40;
              auVar95 = vrcpps_avx(local_aa0);
              auVar124._8_4_ = 0x3f800000;
              auVar124._0_8_ = 0x3f8000003f800000;
              auVar124._12_4_ = 0x3f800000;
              auVar124._16_4_ = 0x3f800000;
              auVar124._20_4_ = 0x3f800000;
              auVar124._24_4_ = 0x3f800000;
              auVar124._28_4_ = 0x3f800000;
              auVar99 = vfnmadd213ps_fma(local_aa0,auVar95,auVar124);
              auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar95,auVar95);
              auVar118._8_4_ = 0x219392ef;
              auVar118._0_8_ = 0x219392ef219392ef;
              auVar118._12_4_ = 0x219392ef;
              auVar118._16_4_ = 0x219392ef;
              auVar118._20_4_ = 0x219392ef;
              auVar118._24_4_ = 0x219392ef;
              auVar118._28_4_ = 0x219392ef;
              auVar95 = vcmpps_avx(local_d20,auVar118,5);
              auVar95 = vandps_avx(auVar95,ZEXT1632(auVar99));
              auVar61._4_4_ = fStack_adc * auVar95._4_4_;
              auVar61._0_4_ = local_ae0 * auVar95._0_4_;
              auVar61._8_4_ = fStack_ad8 * auVar95._8_4_;
              auVar61._12_4_ = fStack_ad4 * auVar95._12_4_;
              auVar61._16_4_ = auVar95._16_4_ * 0.0;
              auVar61._20_4_ = auVar95._20_4_ * 0.0;
              auVar61._24_4_ = auVar95._24_4_ * 0.0;
              auVar61._28_4_ = 0;
              auVar96 = vminps_avx(auVar61,auVar124);
              auVar62._4_4_ = auVar92._4_4_ * auVar95._4_4_;
              auVar62._0_4_ = auVar92._0_4_ * auVar95._0_4_;
              auVar62._8_4_ = auVar92._8_4_ * auVar95._8_4_;
              auVar62._12_4_ = auVar92._12_4_ * auVar95._12_4_;
              auVar62._16_4_ = auVar95._16_4_ * 0.0;
              auVar62._20_4_ = auVar95._20_4_ * 0.0;
              auVar62._24_4_ = auVar95._24_4_ * 0.0;
              auVar62._28_4_ = local_ce0._28_4_;
              auVar95 = vminps_avx(auVar62,auVar124);
              auVar101 = vsubps_avx(auVar124,auVar96);
              auVar102 = vsubps_avx(auVar124,auVar95);
              local_9e0 = vblendvps_avx(auVar95,auVar101,local_b40);
              local_a00 = vblendvps_avx(auVar96,auVar102,local_b40);
              local_980._4_4_ = (float)local_b60._4_4_ * local_a60._4_4_;
              local_980._0_4_ = (float)local_b60._0_4_ * local_a60._0_4_;
              local_980._8_4_ = fStack_b58 * local_a60._8_4_;
              local_980._12_4_ = fStack_b54 * local_a60._12_4_;
              local_980._16_4_ = fStack_b50 * local_a60._16_4_;
              local_980._20_4_ = fStack_b4c * local_a60._20_4_;
              local_980._24_4_ = fStack_b48 * local_a60._24_4_;
              local_980._28_4_ = local_9e0._28_4_;
              local_960._4_4_ = (float)local_b60._4_4_ * fVar131;
              local_960._0_4_ = (float)local_b60._0_4_ * fVar125;
              local_960._8_4_ = fStack_b58 * fVar132;
              local_960._12_4_ = fStack_b54 * fVar133;
              local_960._16_4_ = fStack_b50 * fVar134;
              local_960._20_4_ = fStack_b4c * fVar135;
              local_960._24_4_ = fStack_b48 * fVar136;
              local_960._28_4_ = uStack_b44;
              local_9a0[0] = local_a80._0_4_ * (float)local_b60._0_4_;
              local_9a0[1] = local_a80._4_4_ * (float)local_b60._4_4_;
              local_9a0[2] = local_a80._8_4_ * fStack_b58;
              local_9a0[3] = local_a80._12_4_ * fStack_b54;
              fStack_990 = local_a80._16_4_ * fStack_b50;
              fStack_98c = local_a80._20_4_ * fStack_b4c;
              fStack_988 = local_a80._24_4_ * fStack_b48;
              uStack_984 = local_a00._28_4_;
              auVar107 = vpacksswb_avx(auVar107,auVar107);
              uVar70 = (ulong)(byte)(SUB161(auVar107 >> 7,0) & 1 |
                                     (SUB161(auVar107 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar107 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar107 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar107 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar107 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar107 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar107 >> 0x3f,0) << 7);
              fStack_c6c = fStack_c70;
              fStack_c68 = fStack_c70;
              fStack_c64 = fStack_c70;
              do {
                uVar72 = 0;
                for (uVar71 = uVar70; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000)
                {
                  uVar72 = uVar72 + 1;
                }
                uVar67 = *(uint *)((long)&local_b00 + uVar72 * 4);
                pGVar11 = (pSVar9->geometries).items[uVar67].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00588205:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar91;
                  }
                  uVar71 = (ulong)(uint)((int)uVar72 * 4);
                  local_8c0 = *(undefined4 *)(local_a00 + uVar71);
                  local_8a0 = *(undefined4 *)(local_9e0 + uVar71);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar71);
                  local_d50.context = context->user;
                  uVar6 = *(undefined4 *)((long)&local_b20 + uVar71);
                  local_880._4_4_ = uVar6;
                  local_880._0_4_ = uVar6;
                  local_880._8_4_ = uVar6;
                  local_880._12_4_ = uVar6;
                  local_880._16_4_ = uVar6;
                  local_880._20_4_ = uVar6;
                  local_880._24_4_ = uVar6;
                  local_880._28_4_ = uVar6;
                  uVar6 = *(undefined4 *)((long)local_9a0 + uVar71);
                  local_900 = *(undefined4 *)(local_980 + uVar71);
                  local_8e0 = *(undefined4 *)(local_960 + uVar71);
                  local_860._4_4_ = uVar67;
                  local_860._0_4_ = uVar67;
                  local_860._8_4_ = uVar67;
                  local_860._12_4_ = uVar67;
                  local_860._16_4_ = uVar67;
                  local_860._20_4_ = uVar67;
                  local_860._24_4_ = uVar67;
                  local_860._28_4_ = uVar67;
                  local_920[0] = (RTCHitN)(char)uVar6;
                  local_920[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar6;
                  local_920[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar6;
                  local_920[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar6;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar6;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar6;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar6;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar6;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  auVar95 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_d50.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_d50.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_be0 = local_b80;
                  local_d50.valid = (int *)local_be0;
                  local_d50.geometryUserPtr = pGVar11->userPtr;
                  local_d50.hit = local_920;
                  local_d50.N = 8;
                  local_d50.ray = (RTCRayN *)ray;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar95 = ZEXT1632(auVar95._0_16_);
                    (*pGVar11->occlusionFilterN)(&local_d50);
                    auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
                  }
                  auVar101 = vpcmpeqd_avx2(local_be0,_DAT_01faff00);
                  auVar96 = auVar95 & ~auVar101;
                  if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar96 >> 0x7f,0) == '\0') &&
                        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar96 >> 0xbf,0) == '\0') &&
                      (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar96[0x1f]) {
                    auVar101 = auVar101 ^ auVar95;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar95 = ZEXT1632(auVar95._0_16_);
                      (*p_Var15)(&local_d50);
                      auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
                    }
                    auVar96 = vpcmpeqd_avx2(local_be0,_DAT_01faff00);
                    auVar101 = auVar96 ^ auVar95;
                    auVar111._8_4_ = 0xff800000;
                    auVar111._0_8_ = 0xff800000ff800000;
                    auVar111._12_4_ = 0xff800000;
                    auVar111._16_4_ = 0xff800000;
                    auVar111._20_4_ = 0xff800000;
                    auVar111._24_4_ = 0xff800000;
                    auVar111._28_4_ = 0xff800000;
                    auVar95 = vblendvps_avx(auVar111,*(undefined1 (*) [32])(local_d50.ray + 0x100),
                                            auVar96);
                    *(undefined1 (*) [32])(local_d50.ray + 0x100) = auVar95;
                  }
                  if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0x7f,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar101 >> 0xbf,0) != '\0') ||
                      (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar101[0x1f] < '\0') goto LAB_00588205;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                }
                uVar70 = uVar70 ^ 1L << (uVar72 & 0x3f);
              } while (uVar70 != 0);
            }
          }
        }
        auVar151 = ZEXT1664(auVar119);
        auVar147 = ZEXT1664(auVar113);
        auVar144 = ZEXT1664(auVar141);
        auVar140 = ZEXT1664(auVar137);
        auVar130 = ZEXT1664(auVar93);
        lVar68 = lVar68 + 1;
      } while (lVar68 != uVar64 - 8);
    }
LAB_005881ef:
    bVar91 = puVar82 != &local_800;
    if (!bVar91) {
      return bVar91;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }